

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_manager.cpp
# Opt level: O3

void __thiscall cab_manager::update_cab(cab_manager *this,id_type id,node_type from,node_type to)

{
  map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
  *this_00;
  _Atomic_word *p_Var1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>> *this_01;
  mapped_type *pmVar5;
  long lVar6;
  cab_manager *this_02;
  long lVar7;
  __normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
  __it;
  __normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
  __it_00;
  node_type local_5a;
  node_type local_59;
  cab_manager *local_58;
  weak_ptr<cab> local_50;
  undefined1 local_3c [12];
  
  this_00 = &this->_cabs_at_node;
  local_5a = to;
  local_59 = from;
  local_58 = this;
  local_3c._0_4_ = id;
  pmVar4 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](this_00,&local_59);
  __it_00._M_current =
       (pmVar4->super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  pmVar4 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](this_00,&local_59);
  local_3c._4_8_ =
       (pmVar4->super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  lVar6 = local_3c._4_8_ - (long)__it_00._M_current;
  local_50.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_3c;
  if (0 < lVar6 >> 6) {
    lVar7 = (lVar6 >> 6) + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::operator()
                        ((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0>
                          *)&local_50,__it_00);
      this_02 = local_58;
      __it._M_current = __it_00._M_current;
      if (bVar2) goto LAB_0011e2de;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::operator()
                        ((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0>
                          *)&local_50,__it_00._M_current + 1);
      this_02 = local_58;
      __it._M_current = __it_00._M_current + 1;
      if (bVar2) goto LAB_0011e2de;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::operator()
                        ((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0>
                          *)&local_50,__it_00._M_current + 2);
      this_02 = local_58;
      __it._M_current = __it_00._M_current + 2;
      if (bVar2) goto LAB_0011e2de;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::operator()
                        ((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0>
                          *)&local_50,__it_00._M_current + 3);
      this_02 = local_58;
      __it._M_current = __it_00._M_current + 3;
      if (bVar2) goto LAB_0011e2de;
      __it_00._M_current = __it_00._M_current + 4;
      lVar7 = lVar7 + -1;
      lVar6 = lVar6 + -0x40;
    } while (1 < lVar7);
  }
  lVar6 = lVar6 >> 4;
  this_02 = local_58;
  if (lVar6 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar6 != 2) {
      __it._M_current = (weak_ptr<cab> *)local_3c._4_8_;
      if ((lVar6 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::
                  operator()((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0>
                              *)&local_50,__it_00), this_02 = local_58,
         __it._M_current = __it_00._M_current, bVar2)) goto LAB_0011e2de;
      __it._M_current = __it_00._M_current + 1;
    }
    this_02 = local_58;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::operator()
                      ((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0> *
                       )&local_50,__it);
    if (bVar2) goto LAB_0011e2de;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::operator()
                    ((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0> *)
                     &local_50,__it_00);
  __it._M_current = (weak_ptr<cab> *)local_3c._4_8_;
  if (bVar2) {
    __it._M_current = __it_00._M_current;
  }
LAB_0011e2de:
  pmVar4 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](this_00,&local_59);
  std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::_M_erase
            (pmVar4,(iterator)__it._M_current);
  this_01 = (vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>> *)
            std::
            map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
            ::operator[](this_00,&local_5a);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_02,(key_type *)local_3c);
  local_50.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pmVar5->super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_50.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (pmVar5->super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_50.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
           = (local_50.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_50.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
           = (local_50.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_weak_count + 1;
    }
  }
  std::vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>>::
  emplace_back<std::weak_ptr<cab>>(this_01,&local_50);
  if (local_50.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_50.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = (local_50.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_weak_count;
      (local_50.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
           = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*(local_50.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

void cab_manager::update_cab(id_type id, node_type from, node_type to)
{
    auto it = std::find_if(_cabs_at_node[from].begin(), _cabs_at_node[from].end(), 
        [&id](const std::weak_ptr<cab>& cab){
            auto shared = cab.lock();
            return shared->id() == id;
    });
    _cabs_at_node[from].erase(it);
    _cabs_at_node[to].push_back(_cabs[id]);
}